

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O3

void helper_neon_qzip32_arm(void *vd,void *vm)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = *vd;
  uVar2 = *(ulong *)((long)vd + 8);
  uVar3 = *vm;
  *(ulong *)vm = *(long *)((long)vm + 8) << 0x20 | uVar2 & 0xffffffff;
  *(int *)((long)vm + 8) = (int)(uVar2 >> 0x20);
  *(ulong *)vd = uVar3 << 0x20 | uVar1 & 0xffffffff;
  *(ulong *)((long)vd + 8) = uVar3 & 0xffffffff00000000 | uVar1 >> 0x20;
  return;
}

Assistant:

void HELPER(neon_qzip32)(void *vd, void *vm)
{
    uint64_t *rd = vd, *rm = vm;
    uint64_t zd0 = rd[0], zd1 = rd[1];
    uint64_t zm0 = rm[0], zm1 = rm[1];

    uint64_t d0 = ELEM(zd0, 0, 32) | (ELEM(zm0, 0, 32) << 32);
    uint64_t d1 = ELEM(zd0, 1, 32) | (ELEM(zm0, 1, 32) << 32);
    uint64_t m0 = ELEM(zd1, 0, 32) | (ELEM(zm1, 0, 32) << 32);
    uint64_t m1 = ELEM(zd1, 1, 32) | (ELEM(zm1, 1, 32) << 32);

    rm[0] = m0;
    rm[1] = m1;
    rd[0] = d0;
    rd[1] = d1;
}